

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerivedModule.h
# Opt level: O2

ResultType __thiscall
Scine::Core::DerivedModule::detail::exec_if_impl<false>::
execute<boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,1l>,boost::mpl::v_iter<boost::mpl::vector<sample_namespace::DummyModelA,sample_namespace::DummyModelB,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,2l>,Scine::Core::DerivedModule::detail::ModelTypeIdentifierMatches,Scine::Core::DerivedModule::detail::CreateInterfacePointer<Scine::Core::DummyInterface>>
          (exec_if_impl<false> *this,
          v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_1L>
          *param_1,v_iter<boost::mpl::vector<sample_namespace::DummyModelA,_sample_namespace::DummyModelB,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_2L>
                   *param_2,ModelTypeIdentifierMatches *p,
          CreateInterfacePointer<Scine::Core::DummyInterface> *e)

{
  bool bVar1;
  
  bVar1 = ModelTypeIdentifierMatches::operator()(p,(DummyModelB *)0x0);
  if (bVar1) {
    CreateInterfacePointer<Scine::Core::DummyInterface>::operator()
              ((CreateInterfacePointer<Scine::Core::DummyInterface> *)this,(DummyModelB *)e);
  }
  else {
    *(undefined8 *)this = 0;
  }
  return (ResultType)(placeholder *)this;
}

Assistant:

static auto execute(Iter* /* i */, LastIter* /* l */, const Pred& p, const Exec& e) -> typename Exec::ResultType {
    using Item = typename boost::mpl::deref<Iter>::type;

    if (!p(static_cast<Item*>(0))) {
      using Next = typename boost::mpl::next<Iter>::type;
      return exec_if_impl<boost::is_same<Next, LastIter>::value>::execute(static_cast<Next*>(0),
                                                                          static_cast<LastIter*>(0), p, e);
    }

    return e(static_cast<Item*>(0));
  }